

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FeatureSet * google::protobuf::anon_unknown_24::GetParentFeatures(FieldDescriptor *field)

{
  bool bVar1;
  OneofDescriptor *pOVar2;
  FileDescriptor *desc;
  Descriptor *pDVar3;
  FieldDescriptor *field_local;
  
  pOVar2 = FieldDescriptor::containing_oneof(field);
  if (pOVar2 == (OneofDescriptor *)0x0) {
    bVar1 = FieldDescriptor::is_extension(field);
    if (bVar1) {
      pDVar3 = FieldDescriptor::extension_scope(field);
      if (pDVar3 == (Descriptor *)0x0) {
        desc = FieldDescriptor::file(field);
        field_local = (FieldDescriptor *)
                      internal::InternalFeatureHelper::GetFeatures<google::protobuf::FileDescriptor>
                                (desc);
      }
      else {
        pDVar3 = FieldDescriptor::extension_scope(field);
        field_local = (FieldDescriptor *)
                      internal::InternalFeatureHelper::GetFeatures<google::protobuf::Descriptor>
                                (pDVar3);
      }
    }
    else {
      pDVar3 = FieldDescriptor::containing_type(field);
      field_local = (FieldDescriptor *)
                    internal::InternalFeatureHelper::GetFeatures<google::protobuf::Descriptor>
                              (pDVar3);
    }
  }
  else {
    pOVar2 = FieldDescriptor::containing_oneof(field);
    field_local = (FieldDescriptor *)
                  internal::InternalFeatureHelper::GetFeatures<google::protobuf::OneofDescriptor>
                            (pOVar2);
  }
  return (FeatureSet *)field_local;
}

Assistant:

const FeatureSet& GetParentFeatures(const FieldDescriptor* field) {
  if (field->containing_oneof() != nullptr) {
    return internal::InternalFeatureHelper::GetFeatures(
        *field->containing_oneof());
  } else if (field->is_extension()) {
    if (field->extension_scope() == nullptr) {
      return internal::InternalFeatureHelper::GetFeatures(*field->file());
    }
    return internal::InternalFeatureHelper::GetFeatures(
        *field->extension_scope());
  }
  return internal::InternalFeatureHelper::GetFeatures(
      *field->containing_type());
}